

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

Error __thiscall wave::File::Impl::WriteHeader(Impl *this,uint64_t data_size)

{
  ulong uVar1;
  streamoff sVar2;
  streamoff sVar3;
  undefined1 auVar4 [16];
  fpos local_60 [16];
  uint32_t local_50;
  uint16_t local_4a;
  uint32_t sample_rate;
  uint16_t channel_number;
  int bytes_per_sample;
  uint16_t bits_per_sample;
  __mbstate_t local_38;
  undefined8 local_30;
  pos_type original_position;
  uint64_t data_size_local;
  Impl *this_local;
  
  original_position._M_state = (__mbstate_t)data_size;
  uVar1 = std::ofstream::is_open();
  if ((uVar1 & 1) == 0) {
    this_local._4_4_ = kNotOpen;
  }
  else {
    auVar4 = std::ostream::tellp();
    original_position._M_off = auVar4._8_8_;
    local_30 = auVar4._0_8_;
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&bytes_per_sample,0);
    std::ostream::seekp(&this->ostream,_bytes_per_sample,local_38);
    channel_number = (this->header).fmt.bits_per_sample;
    sample_rate = channel_number / 8;
    local_4a = (this->header).fmt.num_channel;
    local_50 = (this->header).fmt.sample_rate;
    (this->header).riff.chunk_size =
         original_position._M_state.__count * (channel_number / 8) + 0x24;
    (this->header).fmt.byte_per_block = (short)sample_rate * local_4a;
    (this->header).fmt.byte_rate = local_50 * (this->header).fmt.byte_per_block;
    (this->header).data.sub_chunk_2_size = original_position._M_state.__count * sample_rate;
    std::ostream::write((char *)&this->ostream,(long)&this->header);
    uVar1 = std::ios::fail();
    if ((uVar1 & 1) == 0) {
      local_60 = (fpos  [16])std::ostream::tellp();
      sVar2 = std::fpos::operator_cast_to_long(local_60);
      sVar3 = std::fpos::operator_cast_to_long((fpos *)&local_30);
      if (sVar2 < sVar3) {
        std::ostream::seekp(&this->ostream,local_30,original_position._M_off);
      }
      this->data_offset_ = 0x2c;
      this_local._4_4_ = kNoError;
    }
    else {
      this_local._4_4_ = kWriteError;
    }
  }
  return this_local._4_4_;
}

Assistant:

Error WriteHeader(uint64_t data_size) {
    if (!ostream.is_open()) {
      return kNotOpen;
    }
    auto original_position = ostream.tellp();
    // Position to beginning of file
    ostream.seekp(0);

    // make header
    auto bits_per_sample = header.fmt.bits_per_sample;
    auto bytes_per_sample = bits_per_sample / 8;
    auto channel_number = header.fmt.num_channel;
    auto sample_rate = header.fmt.sample_rate;

    header.riff.chunk_size =
        sizeof(WAVEHeader) + (data_size * (bits_per_sample / 8)) - 8;
    // fmt header
    header.fmt.byte_per_block = bytes_per_sample * channel_number;
    header.fmt.byte_rate = sample_rate * header.fmt.byte_per_block;
    // data header
    header.data.sub_chunk_2_size = data_size * bytes_per_sample;

    ostream.write(reinterpret_cast<char*>(&header), sizeof(WAVEHeader));
    if (ostream.fail()) {
      return kWriteError;
    }

    // reposition to old position if was > to current position
    if (ostream.tellp() < original_position) {
      ostream.seekp(original_position);
    }

    // the offset of data will be right after the headers
    data_offset_ = sizeof(WAVEHeader);
    return kNoError;
  }